

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,counting_iterator<char> *it)

{
  size_t *in_RSI;
  counting_iterator<char> cVar1;
  bool in_stack_0000002b;
  int in_stack_0000002c;
  unsigned_long in_stack_00000030;
  
  cVar1._8_8_ = this;
  cVar1.count_ = (size_t)it;
  cVar1 = internal::format_uint<1u,char,fmt::v5::internal::counting_iterator<char>,unsigned_long>
                    (cVar1,in_stack_00000030,in_stack_0000002c,in_stack_0000002b);
  *in_RSI = cVar1.count_;
  *(char *)(in_RSI + 1) = cVar1.blackhole_;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }